

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O3

void RigidBodyDynamics::CalcBodySpatialJacobian
               (Model *model,VectorNd *Q,uint body_id,MatrixNd *G,bool update_kinematics)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pFVar8;
  pointer pJVar9;
  pointer pSVar10;
  pointer ppCVar11;
  pointer pMVar12;
  double *pdVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  SpatialTransform *pSVar18;
  SpatialTransform *pSVar19;
  ulong uVar20;
  undefined3 in_register_00000081;
  ulong uVar21;
  double dVar22;
  byte bVar23;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  type tmp;
  assign_op<double,_double> local_441;
  SpatialTransform *local_440;
  DstEvaluatorType local_438;
  plainobjectbase_evaluator_data<double,_6> local_420;
  SrcXprType local_418;
  double local_408;
  double dStack_400;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_3f0;
  SpatialTransform local_3d0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_6,__1,_0,_6,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_370;
  undefined8 local_350;
  double local_348;
  long local_340;
  SpatialTransform local_338;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  SpatialTransform local_248;
  SpatialMatrix local_1e8;
  double local_c8;
  
  bVar23 = 0;
  uVar21 = (ulong)body_id;
  local_440 = (SpatialTransform *)G;
  if (CONCAT31(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar20 = (ulong)(body_id - model->fixed_body_discriminator);
  if ((body_id == 0xffffffff || body_id < model->fixed_body_discriminator) ||
     (pFVar8 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar17 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8 >> 4) *
              -0x79435e50d79435e5, uVar17 < uVar20 || uVar17 - uVar20 == 0)) {
    pSVar10 = (model->X_base).
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = *(double *)&pSVar10[uVar21].E.super_Matrix3d;
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8);
    pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x10);
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = *pdVar13;
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = pdVar13[1];
    pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x20);
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = *pdVar13;
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = pdVar13[1];
    pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = *pdVar13;
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = pdVar13[1];
    local_248.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x40);
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         *(double *)
          &pSVar10[uVar21].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] =
         *(double *)
          ((long)&pSVar10[uVar21].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pSVar10[uVar21].r.super_Vector3d + 0x10);
  }
  else {
    uVar21 = (ulong)pFVar8[uVar20].mMovableParent;
    Math::SpatialTransform::operator*
              ((SpatialTransform *)&local_1e8,&pFVar8[uVar20].mParentTransform,
               (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar21);
    pSVar18 = (SpatialTransform *)&local_1e8;
    pSVar19 = &local_248;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (pSVar18->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar18 = (SpatialTransform *)((long)pSVar18 + (ulong)bVar23 * -0x10 + 8);
      pSVar19 = (SpatialTransform *)((long)pSVar19 + ((ulong)bVar23 * -2 + 1) * 8);
    }
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb];
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9];
    local_248.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] =
         local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10];
  }
  if ((int)uVar21 != 0) {
    do {
      pJVar9 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar22 = (double)(ulong)pJVar9[uVar21].q_index;
      if (pJVar9[uVar21].mJointType == JointTypeCustom) {
        uVar14 = pJVar9[uVar21].custom_joint_index;
        pSVar10 = (model->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&pSVar10[uVar21].E.super_Matrix3d;
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[3] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[4] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x20);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[5] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x38);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[6] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x10);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[7] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x28);
        local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[8] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x40);
        dVar2 = *(double *)
                 &pSVar10[uVar21].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
        pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        pdVar1 = (double *)((long)&pSVar10[uVar21].r.super_Vector3d + 8);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        pdVar1 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_338.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (dVar2 * -*(double *)&pSVar10[uVar21].E.super_Matrix3d - dVar3 * *pdVar13) -
             *pdVar1 * dVar4;
        local_338.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1] =
             (dVar2 * -*(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8) - dVar3 * pdVar13[1]
             ) - pdVar1[1] * dVar4;
        local_338.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] =
             (-local_338.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [8] * dVar4 -
             local_338.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[7] * dVar3) -
             dVar2 * local_338.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[6];
        local_408 = dVar22;
        Math::SpatialTransform::operator*
                  ((SpatialTransform *)&stack0xffffffffffffff38,&local_248,&local_338);
        Math::SpatialTransform::toMatrix(&local_1e8,(SpatialTransform *)&stack0xffffffffffffff38);
        ppCVar11 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_418.m_rhs = (RhsNested)(ppCVar11[uVar14] + 0x70);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] = (double)(ulong)*(uint *)(ppCVar11[uVar14] + 8);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[6] =
             (local_440->E).super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] =
             (double)((double *)
                      (local_440->E).super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[0] +
                     (long)local_3d0.E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[6] * (long)local_408);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = 2.96439387504748e-323;
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[3] = (double)local_440;
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[4] = 0.0;
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[5] = local_408;
        local_438.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = (PointerType)0x0;
        local_438.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        ._8_8_ = 0;
        local_418.m_lhs = &local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_6,__1,_0,_6,__1> *)&local_438,&local_418,
              (assign_op<double,_double> *)&local_370);
        local_420.data =
             local_438.
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_data;
        local_3f0.m_dst =
             (DstEvaluatorType *)
             local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        local_3f0.m_functor =
             (assign_op<double,_double> *)
             (((Matrix3d *)
              local_3d0.E.super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
              )->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1];
        local_370.m_dst = (DstEvaluatorType *)&local_3f0;
        local_370.m_src = (SrcEvaluatorType *)&local_420;
        local_370.m_functor = &local_441;
        local_370.m_dstExpr = (DstXprType *)&local_3d0;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_370);
        free(local_438.
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_data);
      }
      else if (pJVar9[uVar21].mDoFCount == 3) {
        pSVar10 = (model->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&pSVar10[uVar21].E.super_Matrix3d;
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[3] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[4] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x20);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[5] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x38);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[6] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x10);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[7] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x28);
        local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[8] = *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x40);
        dVar2 = *(double *)
                 &pSVar10[uVar21].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
        pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        pdVar1 = (double *)((long)&pSVar10[uVar21].r.super_Vector3d + 8);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        pdVar1 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_3d0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (dVar2 * -*(double *)&pSVar10[uVar21].E.super_Matrix3d - dVar3 * *pdVar13) -
             *pdVar1 * dVar4;
        local_3d0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1] =
             (dVar2 * -*(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8) - dVar3 * pdVar13[1]
             ) - pdVar1[1] * dVar4;
        local_3d0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] =
             (-local_3d0.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [8] * dVar4 -
             local_3d0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[7] * dVar3) -
             dVar2 * local_3d0.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[6];
        Math::SpatialTransform::operator*(&local_338,&local_248,&local_3d0);
        Math::SpatialTransform::toMatrix(&local_1e8,&local_338);
        pMVar12 = (model->multdof3_S).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_438.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             (long)(local_440->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[1];
        local_438.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = (double *)
                  (local_440->E).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[0] +
                  (long)dVar22 *
                  local_438.
                  super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_outerStride.m_value;
        local_370.m_src = (SrcEvaluatorType *)0x6;
        local_370.m_functor = (assign_op<double,_double> *)0x3;
        local_370.m_dstExpr = (DstXprType *)local_440;
        local_350 = 0;
        local_408 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x12];
        dStack_400 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13];
        local_258 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x18];
        dStack_250 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19];
        local_268 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x1e];
        dStack_260 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f];
        local_278 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0];
        dStack_270 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
        local_288 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[2];
        dStack_280 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
        local_298 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[4];
        dStack_290 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
        local_2a8 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[6];
        dStack_2a0 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7];
        local_2b8 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[8];
        dStack_2b0 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[9];
        local_2c8 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0xe];
        dStack_2c0 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xf];
        local_2d8 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x14];
        dStack_2d0 = local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x15];
        lVar15 = 0;
        do {
          dVar2 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15);
          dVar3 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15 + 8);
          dVar4 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15 + 0x10);
          dVar5 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15 + 0x18);
          dVar6 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15 + 0x20);
          dVar7 = *(double *)
                   ((long)&pMVar12[uVar21].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   lVar15 + 0x28);
          *(double *)((long)&stack0xffffffffffffff38 + lVar15) =
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x1e] * dVar7 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x18] * dVar6 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x12] * dVar5 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0xc] * dVar4 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [6] * dVar3 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0] * dVar2;
          *(double *)(&stack0xffffffffffffff40 + lVar15) =
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x1f] * dVar7 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x19] * dVar6 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x13] * dVar5 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0xd] * dVar4 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [7] * dVar3 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1] * dVar2;
          *(double *)(&stack0xffffffffffffff48 + lVar15) =
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x20] * dVar7 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x1a] * dVar6 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x14] * dVar5 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0xe] * dVar4 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [8] * dVar3 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [2] * dVar2;
          *(double *)(&stack0xffffffffffffff50 + lVar15) =
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x21] * dVar7 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x1b] * dVar6 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x15] * dVar5 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0xf] * dVar4 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [9] * dVar3 +
               local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [3] * dVar2;
          *(double *)(&stack0xffffffffffffff58 + lVar15) =
               dVar7 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x22] +
               dVar6 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1c] +
               dVar5 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x16] +
               dVar4 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x10] +
               dVar3 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[10] +
               dVar2 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[4];
          *(double *)(&stack0xffffffffffffff60 + lVar15) =
               dVar7 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x23] +
               dVar6 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1d] +
               dVar5 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x17] +
               dVar4 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x11] +
               dVar3 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xb] +
               dVar2 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[5];
          lVar15 = lVar15 + 0x30;
        } while (lVar15 != 0x90);
        local_418.m_lhs = (LhsNested)&stack0xffffffffffffff38;
        local_3f0.m_dst = &local_438;
        local_3f0.m_src = (SrcEvaluatorType *)&local_418;
        local_3f0.m_functor = (assign_op<double,_double> *)&local_420;
        local_3f0.m_dstExpr = (DstXprType *)&local_370;
        local_370.m_dst =
             (DstEvaluatorType *)
             local_438.
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_data;
        local_348 = dVar22;
        local_340 = local_438.
                    super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_outerStride.m_value;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_3f0);
      }
      else if (pJVar9[uVar21].mDoFCount == 1) {
        pSVar10 = (model->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             *(double *)&pSVar10[uVar21].E.super_Matrix3d;
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x20);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x38);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x10);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x28);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
             *(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x40);
        dVar2 = *(double *)
                 &pSVar10[uVar21].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
        pdVar13 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x18);
        pdVar1 = (double *)((long)&pSVar10[uVar21].r.super_Vector3d + 8);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        pdVar1 = (double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 0x30);
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
             (dVar2 * -*(double *)&pSVar10[uVar21].E.super_Matrix3d - dVar3 * *pdVar13) -
             *pdVar1 * dVar4;
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
             (dVar2 * -*(double *)((long)&pSVar10[uVar21].E.super_Matrix3d + 8) - dVar3 * pdVar13[1]
             ) - pdVar1[1] * dVar4;
        local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
             (-local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [8] * dVar4 -
             local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7]
             * dVar3) -
             dVar2 * local_1e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[6];
        Math::SpatialTransform::apply
                  ((SpatialTransform *)&local_1e8,
                   (model->S).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar21);
        Math::SpatialTransform::apply(&local_248,(SpatialVector *)&local_338);
        pdVar13 = (double *)
                  (local_440->E).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[0] +
                  (long)(local_440->E).super_Matrix3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[1] * (long)dVar22;
        if (((ulong)pdVar13 & 7) == 0) {
          uVar14 = (uint)((ulong)pdVar13 >> 3) & 1;
          uVar17 = (ulong)uVar14;
          uVar16 = (ulong)(6 - uVar14 & 0xfffffffe);
          uVar20 = uVar17;
          if (((ulong)pdVar13 >> 3 & 1) != 0) {
            *pdVar13 = local_c8;
          }
          do {
            dVar22 = *(double *)(&stack0xffffffffffffff40 + uVar20 * 8);
            pdVar13[uVar20] = *(double *)((long)&stack0xffffffffffffff38 + uVar20 * 8);
            (pdVar13 + uVar20)[1] = dVar22;
            uVar20 = uVar20 + 2;
          } while (uVar20 < uVar16 + uVar17);
          if (uVar17 != 0) {
            uVar20 = (uVar17 + uVar16) - 1;
            do {
              pdVar13[uVar20 + 1] = *(double *)(&stack0xffffffffffffff40 + uVar20 * 8);
              uVar20 = uVar20 + 1;
            } while (uVar20 < 5);
          }
        }
        else {
          lVar15 = 0;
          do {
            pdVar13[lVar15] = *(double *)((long)&stack0xffffffffffffff38 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 6);
        }
      }
      uVar14 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      uVar21 = (ulong)uVar14;
    } while (uVar14 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcBodySpatialJacobian (
    Model &model,
    const VectorNd &Q,
    unsigned int body_id,
    MatrixNd &G,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  assert (G.rows() == 6 && G.cols() == model.qdot_size );

  unsigned int reference_body_id = body_id;

  SpatialTransform base_to_body;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id   = body_id
      - model.fixed_body_discriminator;

    reference_body_id       = model
      .mFixedBodies[fbody_id]
      .mMovableParent;

    base_to_body = model.mFixedBodies[fbody_id]
      .mParentTransform
      * model.X_base[reference_body_id];
  } else {
    base_to_body = model.X_base[reference_body_id];
  }

  unsigned int j = reference_body_id;

  while (j != 0) {
    unsigned int q_index = model.mJoints[j].q_index;

    if(model.mJoints[j].mJointType != JointTypeCustom){
      if (model.mJoints[j].mDoFCount == 1) {
        G.block(0,q_index,6,1) =
          base_to_body.apply(
              model.X_base[j]
              .inverse()
              .apply(model.S[j])
              );
      } else if (model.mJoints[j].mDoFCount == 3) {
        G.block(0,q_index,6,3) =
          (base_to_body * model.X_base[j].inverse()
          ).toMatrix() * model.multdof3_S[j];
      }
    }else if(model.mJoints[j].mJointType == JointTypeCustom) {
      unsigned int k = model.mJoints[j].custom_joint_index;

      G.block(0,q_index,6,model.mCustomJoints[k]->mDoFCount ) =
        (base_to_body * model.X_base[j].inverse()
        ).toMatrix() * model.mCustomJoints[k]->S;
    }

    j = model.lambda[j];
  }
}